

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool ON_BrepRemoveSlits(ON_BrepFace *F)

{
  ON_BrepTrim *this;
  double dVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  TYPE TVar5;
  uint *puVar6;
  int *piVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  TYPE TVar11;
  ON_Brep *pOVar12;
  ulong uVar13;
  ON_BrepFace *face;
  ON_BrepLoop *pOVar14;
  ON_Brep *pOVar15;
  ON_BrepEdge *pOVar16;
  ON_BrepLoop *pOVar17;
  ON_Surface *pOVar18;
  double *pdVar19;
  ON_SimpleArray<int> *pOVar20;
  ON_BrepLoop *pOVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  ON_BrepTrim *pOVar29;
  ON_BrepTrim *pOVar30;
  int iVar31;
  bool bVar32;
  ulong uVar33;
  double dVar34;
  _func_int **extraout_XMM0_Qa;
  double dVar35;
  bool *in_XMM1_Qa;
  int local_134;
  ON_Brep *local_130;
  ON_SimpleArray<bool> bUsed;
  ON_ClassArray<ON_SimpleArray<int>_> NewLoops;
  ON_2dPoint AP;
  int local_b0;
  ON_SimpleArray<bool> bIsSlit;
  ON_SimpleArray<int> slits;
  
  if (-1 < F->m_face_index) {
    pOVar12 = ON_BrepFace::Brep(F);
    if (pOVar12 != (ON_Brep *)0x0) {
      uVar4 = (F->m_li).m_count;
      uVar13 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar13 = 0;
      }
      uVar25 = 0;
      bVar32 = false;
      do {
        if (uVar25 == uVar13) {
          return bVar32;
        }
        iVar26 = (F->m_li).m_a[uVar25];
        pOVar21 = (pOVar12->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                  m_a;
        if (-1 < pOVar21[iVar26].m_loop_index) {
          pOVar21 = pOVar21 + iVar26;
          face = ON_BrepLoop::Face(pOVar21);
          if ((face != (ON_BrepFace *)0x0) &&
             (local_130 = ON_BrepLoop::Brep(pOVar21), local_130 != (ON_Brep *)0x0)) {
            ON_SimpleArray<bool>::ON_SimpleArray(&bIsSlit,(long)(pOVar21->m_ti).m_count);
            ON_SimpleArray<int>::ON_SimpleArray(&slits,(long)(pOVar21->m_ti).m_count);
            uVar4 = (pOVar21->m_ti).m_count;
            uVar33 = 0;
            uVar23 = 0;
            if (0 < (int)uVar4) {
              uVar23 = (ulong)uVar4;
            }
            bVar8 = true;
            bVar9 = false;
            for (; uVar23 != uVar33; uVar33 = uVar33 + 1) {
              iVar26 = (pOVar21->m_ti).m_a[uVar33];
              pOVar30 = (local_130->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                        super_ON_ClassArray<ON_BrepTrim>.m_a;
              uVar22 = pOVar30[iVar26].m_trim_index;
              if ((int)uVar22 < 0) {
LAB_0043e3c8:
                bUsed._vptr_ON_SimpleArray =
                     (_func_int **)((ulong)bUsed._vptr_ON_SimpleArray & 0xffffffffffffff00);
                ON_SimpleArray<bool>::Append(&bIsSlit,(bool *)&bUsed);
                bVar8 = false;
              }
              else {
                this = pOVar30 + iVar26;
                pOVar14 = ON_BrepTrim::Loop(this);
                if ((((pOVar14 == (ON_BrepLoop *)0x0) ||
                     (pOVar15 = ON_BrepTrim::Brep(this), pOVar15 == (ON_Brep *)0x0)) ||
                    (pOVar16 = ON_BrepTrim::Edge(this), pOVar16 == (ON_BrepEdge *)0x0)) ||
                   ((pOVar16->m_edge_index < 0 || ((pOVar16->m_ti).m_count != 2))))
                goto LAB_0043e3c8;
                puVar6 = (uint *)(pOVar16->m_ti).m_a;
                uVar10 = *puVar6;
                if (uVar10 == uVar22) {
                  uVar10 = puVar6[1];
                }
                if ((int)uVar10 < 0) goto LAB_0043e3c8;
                pOVar29 = (pOVar15->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                          super_ON_ClassArray<ON_BrepTrim>.m_a;
                if (pOVar29[uVar10].m_trim_index < 0) goto LAB_0043e3c8;
                pOVar29 = pOVar29 + uVar10;
                pOVar17 = ON_BrepTrim::Loop(pOVar29);
                if ((pOVar17 != pOVar14) ||
                   (pOVar18 = ON_BrepTrim::SurfaceOf(this), pOVar18 == (ON_Surface *)0x0))
                goto LAB_0043e3c8;
                (*(pOVar18->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar18,0);
                dVar34 = ON_Interval::Length((ON_Interval *)&bUsed);
                (*(pOVar18->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar18,1);
                bUsed._vptr_ON_SimpleArray = extraout_XMM0_Qa;
                bUsed.m_a = in_XMM1_Qa;
                dVar35 = ON_Interval::Length((ON_Interval *)&bUsed);
                bVar2 = this->m_bRev3d;
                bVar3 = pOVar29->m_bRev3d;
                ON_Curve::PointAtStart((ON_3dPoint *)&bUsed,(ON_Curve *)this);
                ON_2dPoint::ON_2dPoint((ON_2dPoint *)&NewLoops,(ON_3dPoint *)&bUsed);
                if (bVar2 == bVar3) {
                  ON_Curve::PointAtStart((ON_3dPoint *)&bUsed,(ON_Curve *)pOVar29);
                }
                else {
                  ON_Curve::PointAtEnd((ON_3dPoint *)&bUsed,(ON_Curve *)pOVar29);
                }
                ON_2dPoint::ON_2dPoint(&AP,(ON_3dPoint *)&bUsed);
                pdVar19 = ON_2dPoint::operator[]((ON_2dPoint *)&NewLoops,0);
                dVar1 = *pdVar19;
                pdVar19 = ON_2dPoint::operator[](&AP,0);
                if (dVar34 * 0.25 < ABS(dVar1 - *pdVar19)) goto LAB_0043e3c8;
                pdVar19 = ON_2dPoint::operator[]((ON_2dPoint *)&NewLoops,1);
                dVar1 = *pdVar19;
                pdVar19 = ON_2dPoint::operator[](&AP,1);
                if (dVar35 * 0.25 < ABS(dVar1 - *pdVar19)) goto LAB_0043e3c8;
                ON_Curve::PointAtEnd((ON_3dPoint *)&bUsed,(ON_Curve *)this);
                ON_2dPoint::operator=((ON_2dPoint *)&NewLoops,(ON_3dPoint *)&bUsed);
                if (bVar2 == bVar3) {
                  ON_Curve::PointAtEnd((ON_3dPoint *)&bUsed,(ON_Curve *)pOVar29);
                }
                else {
                  ON_Curve::PointAtStart((ON_3dPoint *)&bUsed,(ON_Curve *)pOVar29);
                }
                ON_2dPoint::operator=(&AP,(ON_3dPoint *)&bUsed);
                pdVar19 = ON_2dPoint::operator[]((ON_2dPoint *)&NewLoops,0);
                dVar1 = *pdVar19;
                pdVar19 = ON_2dPoint::operator[](&AP,0);
                if (dVar34 * 0.25 < ABS(dVar1 - *pdVar19)) goto LAB_0043e3c8;
                pdVar19 = ON_2dPoint::operator[]((ON_2dPoint *)&NewLoops,1);
                dVar34 = *pdVar19;
                pdVar19 = ON_2dPoint::operator[](&AP,1);
                if (dVar35 * 0.25 < ABS(dVar34 - *pdVar19)) goto LAB_0043e3c8;
                bUsed._vptr_ON_SimpleArray =
                     (_func_int **)CONCAT71(bUsed._vptr_ON_SimpleArray._1_7_,1);
                ON_SimpleArray<bool>::Append(&bIsSlit,(bool *)&bUsed);
                bVar9 = true;
                ON_SimpleArray<int>::Append(&slits,&pOVar30[iVar26].m_trim_index);
              }
            }
            if (bVar8) {
              bVar32 = true;
              ON_Brep::DeleteLoop(local_130,pOVar21,true);
            }
            else if (bVar9) {
              ON_SimpleArray<bool>::ON_SimpleArray(&bUsed,&bIsSlit);
              NewLoops._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0081f9a0;
              NewLoops.m_a = (ON_SimpleArray<int> *)0x0;
              NewLoops.m_count = 0;
              NewLoops.m_capacity = 0;
              iVar26 = 0;
LAB_0043e6ec:
              local_b0 = (int)uVar23;
              if (iVar26 != local_b0) {
                for (uVar33 = 0; uVar4 != uVar33; uVar33 = uVar33 + 1) {
                  if (bUsed.m_a[uVar33] == false) {
                    AP.x._0_4_ = (int)uVar33;
                    pOVar20 = ON_ClassArray<ON_SimpleArray<int>_>::AppendNew(&NewLoops);
                    ON_SimpleArray<int>::Append(pOVar20,(int *)&AP);
                    iVar26 = iVar26 + 1;
                    bUsed.m_a[AP.x._0_4_] = true;
                    uVar33 = (long)(AP.x._0_4_ + 1) % (long)(int)uVar4;
                    local_134 = (int)uVar33;
                    uVar33 = uVar33 & 0xffffffff;
                    uVar22 = 0;
LAB_0043e755:
                    do {
                      iVar28 = (int)uVar33;
                      do {
                        if ((int)uVar4 <= (int)uVar22) goto LAB_0043e9fb;
                        if (bUsed.m_a[iVar28] == false) {
                          ON_SimpleArray<int>::Append(pOVar20,&local_134);
                          bUsed.m_a[local_134] = true;
                          uVar33 = (long)(local_134 + 1) % (long)(int)uVar4;
                          local_134 = (int)uVar33;
                          uVar33 = uVar33 & 0xffffffff;
                          uVar22 = uVar22 + 1;
                          goto LAB_0043e755;
                        }
                        if (iVar28 == AP.x._0_4_) goto LAB_0043e6ec;
                      } while (bIsSlit.m_a[iVar28] != true);
                      pOVar30 = (local_130->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                super_ON_ClassArray<ON_BrepTrim>.m_a + (pOVar21->m_ti).m_a[iVar28];
                      pOVar16 = ON_BrepTrim::Edge(pOVar30);
                      piVar7 = (pOVar16->m_ti).m_a;
                      local_134 = -1;
                      iVar31 = ~uVar22 + iVar28;
                      uVar33 = 0;
                      while( true ) {
                        if (uVar23 == uVar33) goto LAB_0043e9fb;
                        if ((pOVar21->m_ti).m_a[uVar33] == piVar7[*piVar7 == pOVar30->m_trim_index])
                        break;
                        uVar33 = uVar33 + 1;
                        iVar31 = iVar31 + -1;
                      }
                      uVar22 = uVar4;
                      if (iVar28 < (int)uVar33) {
                        uVar22 = 0;
                      }
                      uVar33 = (long)((int)uVar33 + 1) % (long)(int)uVar4;
                      local_134 = (int)uVar33;
                      uVar33 = uVar33 & 0xffffffff;
                      uVar22 = uVar22 - iVar31;
                    } while( true );
                  }
                }
                if (iVar26 < (int)uVar4) {
                  for (lVar24 = 0; lVar24 < NewLoops.m_count; lVar24 = lVar24 + 1) {
                    piVar7 = (pOVar21->m_ti).m_a;
                    for (lVar27 = 0; lVar27 < NewLoops.m_a[lVar24].m_count; lVar27 = lVar27 + 1) {
                      NewLoops.m_a[lVar24].m_a[lVar27] = piVar7[NewLoops.m_a[lVar24].m_a[lVar27]];
                    }
                  }
                  TVar5 = pOVar21->m_type;
                  for (lVar24 = 0; lVar24 < slits.m_count; lVar24 = lVar24 + 1) {
                    iVar26 = slits.m_a[lVar24];
                    pOVar30 = (local_130->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                              super_ON_ClassArray<ON_BrepTrim>.m_a;
                    pOVar30[iVar26].m_li = -1;
                    ON_Brep::DeleteTrim(local_130,pOVar30 + iVar26,true);
                  }
                  if (-1 < (pOVar21->m_ti).m_capacity) {
                    (pOVar21->m_ti).m_count = 0;
                  }
                  ON_Brep::DeleteLoop(local_130,pOVar21,true);
                  for (lVar24 = 0; lVar24 < NewLoops.m_count; lVar24 = lVar24 + 1) {
                    pOVar21 = ON_Brep::NewLoop(local_130,unknown,face);
                    pOVar20 = NewLoops.m_a + lVar24;
                    ON_SimpleArray<int>::operator=(&pOVar21->m_ti,pOVar20);
                    iVar26 = pOVar21->m_loop_index;
                    uVar23 = (ulong)(uint)pOVar20->m_count;
                    if (pOVar20->m_count < 1) {
                      uVar23 = 0;
                    }
                    for (uVar33 = 0; uVar23 != uVar33; uVar33 = uVar33 + 1) {
                      (local_130->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                      super_ON_ClassArray<ON_BrepTrim>.m_a[pOVar20->m_a[uVar33]].m_li = iVar26;
                    }
                    TVar11 = ON_Brep::ComputeLoopType(local_130,pOVar21);
                    pOVar21->m_type = TVar11;
                    if (TVar11 == outer && TVar5 == outer) {
                      piVar7 = (face->m_li).m_a;
                      iVar26 = *piVar7;
                      iVar28 = pOVar21->m_loop_index;
                      *piVar7 = iVar28;
                      uVar23 = (ulong)(uint)(face->m_li).m_count;
                      do {
                        if ((int)uVar23 < 2) goto LAB_0043e9cf;
                        uVar33 = uVar23 - 1;
                        lVar27 = uVar23 - 1;
                        uVar23 = uVar33;
                      } while (piVar7[lVar27] != iVar28);
                      piVar7[uVar33] = iVar26;
                    }
LAB_0043e9cf:
                    ON_Brep::MatchTrimEnds(local_130,pOVar21);
                    (*(local_130->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])
                              (local_130,pOVar21,1);
                  }
                  bVar32 = true;
                }
              }
LAB_0043e9fb:
              ON_ClassArray<ON_SimpleArray<int>_>::~ON_ClassArray(&NewLoops);
              ON_SimpleArray<bool>::~ON_SimpleArray(&bUsed);
            }
            ON_SimpleArray<int>::~ON_SimpleArray(&slits);
            ON_SimpleArray<bool>::~ON_SimpleArray(&bIsSlit);
          }
        }
        uVar25 = uVar25 + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool ON_BrepRemoveSlits(ON_BrepFace& F)

{
  //For each loop, look for slit pairs that fall between non slits and 
  //break the loop at the pair.
  //After all loops have been split, call ON_Brep::RemoveSlits() on the result.

  if (F.m_face_index < 0)
    return false;
  ON_Brep* pB = F.Brep();
  if (!pB)
    return false;
  bool rc = false;
  int loop_count = F.m_li.Count();
  int i;
  for (i=0; i<loop_count; i++){
    ON_BrepLoop& L = pB->m_L[F.m_li[i]];
    if (L.m_loop_index < 0)
      continue;
    if (ON_BrepRemoveSlits(L))
      rc = true;
  }
  return rc;
}